

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test264.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  bitstream *pbVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  h264_slice *slice_00;
  long in_RSI;
  int in_EDI;
  bitstream *nstr;
  int infer_cbp;
  int mbt;
  int kk;
  int tt [4];
  int x;
  int k;
  int j;
  int i;
  h264_slice *slice;
  h264_picparm *picparm;
  h264_seqparm *seqparm;
  uint32_t val;
  bitstream *str;
  FILE *out;
  uint32_t *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  vs_type in_stack_ffffffffffffff94;
  uint local_68 [6];
  int in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  uint uVar7;
  uint uVar8;
  FILE *local_18;
  int local_4;
  
  local_18 = (FILE *)0x0;
  if ((in_EDI < 2) || (local_18 = fopen(*(char **)(in_RSI + 8),"w"), local_18 != (FILE *)0x0)) {
    pbVar3 = vs_new_encode((vs_type)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    iVar1 = vs_start((bitstream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff80);
    if (iVar1 == 0) {
      pvVar4 = calloc(0xcd8,1);
      pvVar5 = calloc(0x8a8,1);
      pvVar6 = calloc(0xc48,1);
      *(undefined4 *)((long)pvVar4 + 0xc30) = 0;
      *(undefined4 *)((long)pvVar4 + 0xc38) = 0;
      *(undefined4 *)((long)pvVar5 + 0x10) = 0;
      *(undefined4 *)((long)pvVar5 + 0xb0) = 0;
      *(undefined4 *)((long)pvVar5 + 0xb8) = 1;
      *(undefined4 *)((long)pvVar5 + 8) = 1;
      *(void **)((long)pvVar6 + 0x30) = pvVar4;
      *(void **)((long)pvVar6 + 0x38) = pvVar5;
      *(undefined4 *)((long)pvVar6 + 0xc24) = 0x1a;
      *(undefined4 *)((long)pvVar6 + 0xc18) = 8;
      *(int *)((long)pvVar6 + 0xc20) = *(int *)((long)pvVar6 + 0xc18) * 0x18;
      *(undefined4 *)((long)pvVar6 + 0x2c) = 0;
      *(undefined4 *)((long)pvVar6 + 4) = 1;
      *(undefined4 *)((long)pvVar6 + 0x40) = 0;
      *(undefined4 *)((long)pvVar6 + 0xc28) = 0;
      *(undefined4 *)((long)pvVar6 + 0x50) = 1;
      *(undefined4 *)((long)pvVar6 + 0xbf4) = 2;
      *(undefined4 *)((long)pvVar6 + 0xc0c) = 1;
      *(undefined4 *)((long)pvVar6 + 0x78) = 0x1f;
      *(undefined4 *)((long)pvVar6 + 0x7c) = 0x1f;
      *(undefined4 *)((long)pvVar6 + 0xc10) = 0;
      *(undefined4 *)((long)pvVar6 + 0xc14) = 0;
      pvVar4 = calloc(0x3774,(ulong)*(uint *)((long)pvVar6 + 0xc20));
      *(void **)((long)pvVar6 + 0xc40) = pvVar4;
      for (uVar8 = 0; iVar1 = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20), (int)uVar8 < 0x60;
          uVar8 = uVar8 + 1) {
        *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774) = (int)uVar8 >> 2 & 1
        ;
        *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) =
             (int)(uVar8 * 3) % 0x30;
        *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xc) = uVar8 & 1;
        *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x10) =
             (int)uVar8 % 5 + -2;
        if ((int)uVar8 < 0x10) {
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) = 0;
        }
        else if ((int)uVar8 < 0x28) {
          *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) = uVar8 - 0xf;
        }
        else if (((int)uVar8 < 0x2c) || (*(int *)((long)pvVar6 + 0x40) != 0)) {
          if (((int)uVar8 < 0x2c) || (*(int *)((long)pvVar6 + 0x40) != 1)) {
            *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) = 0x19;
          }
          else if ((int)uVar8 < 0x30) {
            *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) = 0x38;
          }
          else if ((int)uVar8 < 0x48) {
            *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) = 0x38;
          }
          else {
            *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) = 0x38;
          }
        }
        else if ((int)uVar8 < 0x30) {
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) = 0x20;
        }
        else if ((int)uVar8 < 0x48) {
          in_stack_ffffffffffffffb0 = (int)(uVar8 - 0x30) / 8;
          *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) =
               in_stack_ffffffffffffffb0 + 0x1b;
          if (in_stack_ffffffffffffffb0 == 0) {
            for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcc8 +
                       (long)iVar1 * 4) = (uVar8 & 7) + 0xf;
            }
            for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 0x10;
                in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xce8 +
                       (long)(int)in_stack_ffffffffffffffb8 * 8) = -((uVar8 & 7) + 3);
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcec +
                       (long)(int)in_stack_ffffffffffffffb8 * 8) = uVar8 & 3;
            }
          }
          else if (in_stack_ffffffffffffffb0 == 1) {
            for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
              *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcc8 +
                      (long)iVar1 * 4) = (iVar1 >> 1) + 4;
            }
            for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 0x10;
                in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
              *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xce8 +
                      (long)(int)in_stack_ffffffffffffffb8 * 8) =
                   ((int)in_stack_ffffffffffffffb8 >> 3) + 0xc;
              *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcec +
                      (long)(int)in_stack_ffffffffffffffb8 * 8) =
                   -((int)in_stack_ffffffffffffffb8 >> 3);
            }
          }
          else if (in_stack_ffffffffffffffb0 == 2) {
            for (uVar7 = 0; (int)uVar7 < 4; uVar7 = uVar7 + 1) {
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcc8 +
                       (long)(int)uVar7 * 4) = (uVar7 & 1) + 2;
            }
            for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 0x10;
                in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xce8 +
                       (long)(int)in_stack_ffffffffffffffb8 * 8) =
                   ((int)in_stack_ffffffffffffffb8 >> 2 & 1U) + 6;
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcec +
                       (long)(int)in_stack_ffffffffffffffb8 * 8) =
                   -((int)in_stack_ffffffffffffffb8 >> 2 & 1U);
            }
          }
        }
        else {
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) = 0x1e;
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xc) = 0;
          for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 4;
              in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
            *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcb8 +
                     (long)(int)in_stack_ffffffffffffffb8 * 4) = in_stack_ffffffffffffffb8;
            *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcc8 +
                     (long)(int)in_stack_ffffffffffffffb8 * 4) = in_stack_ffffffffffffffb8 + 1;
            local_68[0] = 0;
            local_68[1] = 2;
            local_68[2] = 1;
            local_68[3] = 3;
            for (in_stack_ffffffffffffffb4 = 0; (int)in_stack_ffffffffffffffb4 < 4;
                in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
              in_stack_ffffffffffffff94 =
                   in_stack_ffffffffffffffb8 * 4 +
                   (in_stack_ffffffffffffffb4 & local_68[(int)in_stack_ffffffffffffffb8]);
              *(vs_type *)
               (*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xce8 +
               (long)(int)(in_stack_ffffffffffffffb8 * 4 + in_stack_ffffffffffffffb4) * 8) =
                   in_stack_ffffffffffffff94 + 0x10;
              *(vs_type *)
               (*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcec +
               (long)(int)(in_stack_ffffffffffffffb8 * 4 + in_stack_ffffffffffffffb4) * 8) =
                   in_stack_ffffffffffffff94 - 0x20;
            }
          }
        }
        if ((*(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) == 0) ||
           (*(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) == 0x1a)) {
          for (uVar7 = 0; (int)uVar7 < 0x10; uVar7 = uVar7 + 1) {
            *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xc14 +
                     (long)(int)uVar7 * 4) = uVar7 & 1;
            *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xc54 +
                    (long)(int)uVar7 * 4) = (int)uVar7 >> 1;
          }
          for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 4;
              in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
            *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xc94 +
                     (long)(int)in_stack_ffffffffffffffb8 * 4) = in_stack_ffffffffffffffb8 & 1;
            *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xca4 +
                    (long)(int)in_stack_ffffffffffffffb8 * 4) = (int)in_stack_ffffffffffffffb8 >> 1;
          }
        }
        if (*(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) < 0x1b) {
          *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcb4) =
               (int)uVar8 >> 2 & 3;
        }
        if ((*(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) == 0x20) ||
           (*(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) == 0x38)) {
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774) = 0;
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) = 0;
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xc) = 0;
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x10) = 0;
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcb4) = 0;
        }
        else if (*(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4) == 0x19)
        {
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) = 0x2f;
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xc) = 0;
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x10) = 0;
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xcb4) = 0;
          for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 0x100;
              in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
            if ((uVar8 & 1) != 0) {
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x414 +
                       (long)(int)in_stack_ffffffffffffffb8 * 4) = in_stack_ffffffffffffffb8;
            }
            if ((uVar8 & 2) != 0) {
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x14 +
                       (long)(int)in_stack_ffffffffffffffb8 * 4) = in_stack_ffffffffffffffb8;
            }
          }
        }
        else {
          iVar1 = h264_is_intra_16x16_mb_type
                            (*(uint32_t *)
                              (*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4));
          if (iVar1 == 0) {
            if (*(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) == 0) {
              *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x10) =
                   0;
            }
            for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 0x10;
                in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
              if ((*(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) >>
                   ((byte)((int)in_stack_ffffffffffffffb8 >> 2) & 0x1f) & 1) != 0) {
                for (in_stack_ffffffffffffffb4 = 0; (int)in_stack_ffffffffffffffb4 < 0x10;
                    in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
                  if (in_stack_ffffffffffffffb8 != 0) {
                    *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x19e8 +
                              (long)(int)in_stack_ffffffffffffffb8 * 0x40 +
                             (long)(int)in_stack_ffffffffffffffb4 * 4) =
                         in_stack_ffffffffffffffb8 * 0x10 + in_stack_ffffffffffffffb4;
                    *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x25e8 +
                              (long)((int)in_stack_ffffffffffffffb8 >> 2) * 0x100 +
                             (long)(int)((in_stack_ffffffffffffffb8 & 3) * 0x10 +
                                        in_stack_ffffffffffffffb4) * 4) =
                         in_stack_ffffffffffffffb8 * 0x10 + in_stack_ffffffffffffffb4;
                  }
                }
              }
            }
          }
          else {
            iVar1 = *(int *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 4);
            in_stack_ffffffffffffff8c = (iVar1 + -1 >> 2) % 3 << 4;
            if (0xc < iVar1) {
              in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c | 0xf;
            }
            *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) =
                 in_stack_ffffffffffffff8c;
            *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xc) = 0;
            for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 0x10;
                in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xde8 +
                       (long)(int)in_stack_ffffffffffffffb8 * 4) = in_stack_ffffffffffffffb8 + 0x100
              ;
              if ((*(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) >>
                   ((byte)((int)in_stack_ffffffffffffffb8 >> 2) & 0x1f) & 1) != 0) {
                for (in_stack_ffffffffffffffb4 = 0; (int)in_stack_ffffffffffffffb4 < 0xf;
                    in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
                  if (in_stack_ffffffffffffffb8 != 0) {
                    *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0xea8 +
                              (long)(int)in_stack_ffffffffffffffb8 * 0x3c +
                             (long)(int)in_stack_ffffffffffffffb4 * 4) =
                         in_stack_ffffffffffffffb8 * 0x10 + in_stack_ffffffffffffffb4 + 1;
                  }
                }
              }
            }
          }
          if ((*(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) & 0x30) !=
              0) {
            for (in_stack_ffffffffffffffb4 = 0; (int)in_stack_ffffffffffffffb4 < 4;
                in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
              *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x31e8 +
                        (long)(int)(uVar8 & 1) * 0x20 + (long)(int)in_stack_ffffffffffffffb4 * 4) =
                   in_stack_ffffffffffffffb4 - 0x10;
            }
          }
          if ((*(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 8) & 0x20) !=
              0) {
            for (in_stack_ffffffffffffffb8 = 0; (int)in_stack_ffffffffffffffb8 < 4;
                in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
              for (in_stack_ffffffffffffffb4 = 0; (int)in_stack_ffffffffffffffb4 < 0xf;
                  in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
                if (in_stack_ffffffffffffffb8 != 1) {
                  *(uint *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774 + 0x3228 +
                            (long)(int)((int)uVar8 >> 1 & 1) * 0x1e0 +
                            (long)(int)in_stack_ffffffffffffffb8 * 0x3c +
                           (long)(int)in_stack_ffffffffffffffb4 * 4) =
                       (in_stack_ffffffffffffffb4 - 0x1000) + in_stack_ffffffffffffffb8 * 0x100;
                }
              }
            }
          }
        }
        if (*(int *)((long)pvVar6 + 0xc28) == 0) {
          *(undefined4 *)(*(long *)((long)pvVar6 + 0xc40) + (long)(int)uVar8 * 0x3774) =
               *(undefined4 *)((long)pvVar6 + 0x50);
        }
      }
      *(uint *)((long)pvVar6 + 0xc2c) = uVar8 - 1;
      iVar2 = h264_slice_data((bitstream *)CONCAT44(uVar8,in_stack_ffffffffffffffb8),
                              (h264_slice *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if (iVar2 == 0) {
        if (local_18 != (FILE *)0x0) {
          fwrite(pbVar3->bytes,(long)pbVar3->bytesnum,1,local_18);
        }
        slice_00 = (h264_slice *)
                   vs_new_decode(in_stack_ffffffffffffff94,
                                 (uint8_t *)
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),iVar1
                                );
        iVar1 = vs_start((bitstream *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (uint32_t *)slice_00);
        if (iVar1 == 0) {
          iVar1 = h264_slice_data((bitstream *)CONCAT44(uVar8,in_stack_ffffffffffffffb8),
                                  (h264_slice *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (iVar1 == 0) {
            h264_print_slice_data(slice_00);
            fprintf(_stderr,"All ok!\n");
            local_4 = 0;
          }
          else {
            h264_print_slice_data(slice_00);
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    perror("fopen");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
	FILE *out = 0;
	if (argc >= 2) {
		out = fopen(argv[1], "w");
		if (!out) {
			perror("fopen");
			return 1;
		}
	}
	struct bitstream *str = vs_new_encode(VS_H264);
	uint32_t val;
	val = 0xde;
	if (vs_start(str, &val))
		return 1;

	struct h264_seqparm *seqparm = calloc(sizeof *seqparm, 1);
	struct h264_picparm *picparm = calloc(sizeof *picparm, 1);
	struct h264_slice *slice = calloc(sizeof *slice, 1);
	seqparm->frame_mbs_only_flag = 0;
	seqparm->direct_8x8_inference_flag = 0;
	picparm->num_slice_groups_minus1 = 0;
	picparm->constrained_intra_pred_flag = 0;
	picparm->transform_8x8_mode_flag = 1;
	picparm->entropy_coding_mode_flag = 1;
	slice->seqparm = seqparm;
	slice->picparm = picparm;
	slice->sliceqpy = 26;
	slice->pic_width_in_mbs = 8;
	slice->pic_size_in_mbs = slice->pic_width_in_mbs * 24;
	slice->first_mb_in_slice = 0;
	slice->nal_unit_type = 1;
	slice->slice_type = H264_SLICE_TYPE_P;
	slice->mbaff_frame_flag = 0;
	slice->field_pic_flag = 1;
	slice->cabac_init_idc = 2;
	slice->chroma_array_type = 1;
	slice->num_ref_idx_l0_active_minus1 = 31;
	slice->num_ref_idx_l1_active_minus1 = 31;
	slice->bit_depth_luma_minus8 = 0;
	slice->bit_depth_chroma_minus8 = 0;
	slice->mbs = calloc(sizeof *slice->mbs, slice->pic_size_in_mbs);
	int i, j, k;
	for (i = 0; i < 96; i++) {
		slice->mbs[i].mb_field_decoding_flag = i >> 2 & 1;
		slice->mbs[i].coded_block_pattern = i * 3 % 48;
		slice->mbs[i].transform_size_8x8_flag = i& 1;
		slice->mbs[i].mb_qp_delta = (i%5) - 2;
		if (i < 16) {
			slice->mbs[i].mb_type = 0;
		} else if (i < 40) {
			slice->mbs[i].mb_type = 1 + (i- 16);
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_P) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_SKIP;
			} else if (i < 72) {
				int x = (i - 48)/8;
				slice->mbs[i].mb_type = H264_MB_TYPE_P_L0_16X16 + x;
				if (x == 0) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 15 + (i & 7);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = -((i & 7) + 3);
						slice->mbs[i].mvd[0][j][1] = (i&3);
					}
				} else if (x == 1) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 4 + (j >> 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 12 + (j >> 3);
						slice->mbs[i].mvd[0][j][1] = -(j >> 3);
					}
				} else if (x == 2) {
					for (j = 0; j < 4; j++)
						slice->mbs[i].ref_idx[0][j] = 2 + (j & 1);
					for (j = 0; j < 16; j++) {
						slice->mbs[i].mvd[0][j][0] = 6 + (j>>2 & 1);
						slice->mbs[i].mvd[0][j][1] = -(j>>2 & 1);
					}
				}
			} else {
				slice->mbs[i].mb_type = H264_MB_TYPE_P_8X8;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 4; j++) {
					slice->mbs[i].sub_mb_type[j] = j;
					slice->mbs[i].ref_idx[0][j] = j+1;
					int tt[4] = { 0, 2, 1, 3};
					for (k = 0; k < 4; k++) {
						int kk = j * 4 + (k & j[tt]);
						slice->mbs[i].mvd[0][j*4+k][0] = 16+kk;
						slice->mbs[i].mvd[0][j*4+k][1] = kk - 32;;
					}
				}
			}
		} else if (i >= 44 && slice->slice_type == H264_SLICE_TYPE_B) {
			if (i < 48) {
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else if (i < 72) {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			} else {
				/* XXX */
				slice->mbs[i].mb_type = H264_MB_TYPE_B_SKIP;
			}
		} else {
			slice->mbs[i].mb_type = H264_MB_TYPE_I_PCM;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_I_NXN || slice->mbs[i].mb_type == H264_MB_TYPE_SI) {
			for (j = 0; j < 16; j++) {
				slice->mbs[i].prev_intra4x4_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra4x4_pred_mode[j] = j >> 1;
			}
			for (j = 0; j < 4; j++) {
				slice->mbs[i].prev_intra8x8_pred_mode_flag[j] = j & 1;
				slice->mbs[i].rem_intra8x8_pred_mode[j] = j >> 1;
			}
		}
		if (slice->mbs[i].mb_type < H264_MB_TYPE_P_BASE) {
			slice->mbs[i].intra_chroma_pred_mode = i >> 2 & 3;
		}
		if (slice->mbs[i].mb_type == H264_MB_TYPE_P_SKIP || slice->mbs[i].mb_type == H264_MB_TYPE_B_SKIP) {
			slice->mbs[i].mb_field_decoding_flag = 0;
			slice->mbs[i].coded_block_pattern = 0;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
		} else if (slice->mbs[i].mb_type == H264_MB_TYPE_I_PCM) {
			slice->mbs[i].coded_block_pattern = 0x2f;
			slice->mbs[i].transform_size_8x8_flag = 0;
			slice->mbs[i].mb_qp_delta = 0;
			slice->mbs[i].intra_chroma_pred_mode = 0;
			for (j = 0; j < 256; j++) {
				if (i & 1)
					slice->mbs[i].pcm_sample_chroma[j] = j;
				if (i & 2)
					slice->mbs[i].pcm_sample_luma[j] = j;
			}
		} else {
			if (h264_is_intra_16x16_mb_type(slice->mbs[i].mb_type)) {
				int mbt = slice->mbs[i].mb_type;
				int infer_cbp = (((mbt - H264_MB_TYPE_I_16X16_0_0_0) >> 2) % 3) << 4;
				if (mbt >= H264_MB_TYPE_I_16X16_0_0_1)
					infer_cbp |= 0xf;
				slice->mbs[i].coded_block_pattern = infer_cbp;
				slice->mbs[i].transform_size_8x8_flag = 0;
				for (j = 0; j < 16; j++) {
					slice->mbs[i].block_luma_dc[0][j] = 0x100 + j;
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 15; k++) {
							if (j) {
								slice->mbs[i].block_luma_ac[0][j][k] = j * 16 + k + 1;
							}
						}
					}
				}
			} else {
				if (!slice->mbs[i].coded_block_pattern)
					slice->mbs[i].mb_qp_delta = 0;
				for (j = 0; j < 16; j++) {
					if (slice->mbs[i].coded_block_pattern >> (j >> 2) & 1) {
						for (k = 0; k < 16; k++) {
							if (j) {
								slice->mbs[i].block_luma_4x4[0][j][k] = j * 16 + k;
								slice->mbs[i].block_luma_8x8[0][j>>2][(j&3)*16+k] = j*16 + k;
							}
						}
					}
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x30) {
				for (k = 0; k < 4; k++) {
					slice->mbs[i].block_chroma_dc[i&1][k] = -0x10 + k;
				}
			}
			if (slice->mbs[i].coded_block_pattern & 0x20) {
				for (j = 0; j < 4; j++) {
					for (k = 0; k < 15; k++) {
						if (j != 1)
							slice->mbs[i].block_chroma_ac[i>>1&1][j][k] = k - 0x1000 + j * 0x100;
					}
				}
			}
		}
		if (!slice->mbaff_frame_flag)
			slice->mbs[i].mb_field_decoding_flag = slice->field_pic_flag;
	}
	slice->last_mb_in_slice = i - 1;
	
	if (h264_slice_data(str, slice)) return 1;

	if (out)
		fwrite(str->bytes, str->bytesnum, 1, out);

	struct bitstream *nstr = vs_new_decode(VS_H264, str->bytes, str->bytesnum);
	if (vs_start(nstr, &val))
		return 1;
	if (val != 0xde) {
		fprintf (stderr, "Fail 1\n");
		return 1;
	}
	if (h264_slice_data(nstr, slice)) {
		h264_print_slice_data(slice);
		return 1;
	}
	h264_print_slice_data(slice);

	fprintf (stderr, "All ok!\n");

	return 0;
}